

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::subtract_example(vw *all,example *ec,example *ecsub)

{
  size_t sVar1;
  example *in_RDX;
  vw *in_RSI;
  features *wap_fs;
  uchar *in_stack_ffffffffffffffd8;
  v_array<unsigned_char> *dat;
  
  dat = (v_array<unsigned_char> *)
        &in_RSI->namespace_dictionaries[0xf7].
         super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   &in_RSI->namespace_dictionaries[0xfb].
    super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  GD::foreach_feature<example_&,_unsigned_long,_&CSOAA::subtract_feature>
            (in_RSI,in_RDX,(example *)dat);
  v_array<unsigned_char>::push_back(dat,in_stack_ffffffffffffffd8);
  sVar1 = features::size((features *)0x424ba3);
  in_RSI[1].namespace_dictionaries[0xec].
  super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(sVar1 + (long)in_RSI[1].namespace_dictionaries[0xec].
                               super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *(float *)((long)&in_RSI[1].namespace_dictionaries[0xed].
                    super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) =
       *(float *)&dat[3]._begin +
       *(float *)((long)&in_RSI[1].namespace_dictionaries[0xed].
                         super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
  return;
}

Assistant:

void subtract_example(vw& all, example* ec, example* ecsub)
{
  features& wap_fs = ec->feature_space[wap_ldf_namespace];
  wap_fs.sum_feat_sq = 0;
  GD::foreach_feature<example&, uint64_t, subtract_feature>(all, *ecsub, *ec);
  ec->indices.push_back(wap_ldf_namespace);
  ec->num_features += wap_fs.size();
  ec->total_sum_feat_sq += wap_fs.sum_feat_sq;
}